

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOSExe.cpp
# Opt level: O0

void __thiscall DOSExe::wrap(DOSExe *this)

{
  mapped_type pEVar1;
  int iVar2;
  DosHdrWrapper *this_00;
  undefined4 extraout_var;
  ExeException *pEVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *ppEVar4;
  key_type local_90;
  undefined1 local_81;
  QString local_80;
  undefined1 local_61;
  QString local_60;
  short *local_48;
  WORD *magic;
  QString local_38;
  DOSExe *local_10;
  DOSExe *this_local;
  
  local_10 = this;
  this_00 = (DosHdrWrapper *)operator_new(0x10);
  DosHdrWrapper::DosHdrWrapper(this_00,(Executable *)this);
  this->dosHdrWrapper = this_00;
  iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[7])(this,0,0x40,0);
  this->m_dosHdr = (IMAGE_DOS_HEADER *)CONCAT44(extraout_var,iVar2);
  if (this->m_dosHdr == (IMAGE_DOS_HEADER *)0x0) {
    magic._7_1_ = 1;
    pEVar3 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_38,"Could not Wrap!");
    ExeException::ExeException(pEVar3,&local_38);
    magic._7_1_ = 0;
    __cxa_throw(pEVar3,&ExeException::typeinfo,ExeException::~ExeException);
  }
  iVar2 = (*(this->dosHdrWrapper->super_ExeElementWrapper).super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0x12])(this->dosHdrWrapper,0,0xffffffffffffffff);
  local_48 = (short *)CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*(this->dosHdrWrapper->super_ExeElementWrapper).super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  if ((CONCAT44(extraout_var_01,iVar2) != 0) && (local_48 != (short *)0x0)) {
    if ((*local_48 != 0x5a4d) && (*local_48 != 0x4d5a)) {
      Logger::append(D_WARNING,"It is not a DOS file!\n");
      local_81 = 1;
      pEVar3 = (ExeException *)__cxa_allocate_exception(0x48);
      QString::QString(&local_80,"It is not a DOS file!");
      ExeException::ExeException(pEVar3,&local_80);
      local_81 = 0;
      __cxa_throw(pEVar3,&ExeException::typeinfo,ExeException::~ExeException);
    }
    pEVar1 = &this->dosHdrWrapper->super_ExeElementWrapper;
    local_90 = 0;
    ppEVar4 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,&local_90);
    *ppEVar4 = pEVar1;
    return;
  }
  local_61 = 1;
  pEVar3 = (ExeException *)__cxa_allocate_exception(0x48);
  QString::QString(&local_60,"Could not Wrap!");
  ExeException::ExeException(pEVar3,&local_60);
  local_61 = 0;
  __cxa_throw(pEVar3,&ExeException::typeinfo,ExeException::~ExeException);
}

Assistant:

void DOSExe::wrap()
{
    this->dosHdrWrapper = new DosHdrWrapper(this);

    m_dosHdr = (IMAGE_DOS_HEADER*) getContentAt(0, sizeof(IMAGE_DOS_HEADER));
    if (m_dosHdr == NULL) throw ExeException("Could not Wrap!");

    WORD* magic = (WORD*) this->dosHdrWrapper->getFieldPtr(DosHdrWrapper::MAGIC);

    if (this->dosHdrWrapper->getPtr() == NULL || magic == NULL) {
        throw ExeException("Could not Wrap!");
    }

    if ((*magic) != pe::S_DOS && (*magic) != pe::S_DOS2) {
        Logger::append(Logger::D_WARNING, "It is not a DOS file!\n");
        throw ExeException("It is not a DOS file!");
    }
    this->wrappers[WR_DOS_HDR] = this->dosHdrWrapper;
}